

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

bool __thiscall
CppJieba::MPSegment::_cut
          (MPSegment *this,SegmentContext *segContext,
          vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *res)

{
  TrieNodeInfo *this_00;
  TrieNodeInfo *pTVar1;
  reference pvVar2;
  size_type sVar3;
  vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *in_RSI;
  value_type *in_RDI;
  TrieNodeInfo nodeInfo;
  TrieNodeInfo *p;
  uint i;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *in_stack_ffffffffffffff80
  ;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    this_00 = (TrieNodeInfo *)(ulong)local_1c;
    pTVar1 = (TrieNodeInfo *)
             std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::size
                       (in_RSI);
    if (pTVar1 <= this_00) break;
    pvVar2 = std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::operator[]
                       (in_RSI,(ulong)local_1c);
    pTVar1 = pvVar2->pInfo;
    if (pTVar1 == (TrieNodeInfo *)0x0) {
      TrieNodeInfo::TrieNodeInfo(this_00);
      std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::operator[]
                (in_RSI,(ulong)local_1c);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_ffffffffffffff80,(value_type *)in_RDI);
      Trie::getMinLogFreq((Trie *)&(in_RDI->word).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (in_stack_ffffffffffffff80,in_RDI);
      local_1c = local_1c + 1;
      TrieNodeInfo::~TrieNodeInfo(this_00);
    }
    else {
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (in_stack_ffffffffffffff80,in_RDI);
      sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&pTVar1->word);
      local_1c = local_1c + (int)sVar3;
    }
  }
  return true;
}

Assistant:

bool _cut(SegmentContext& segContext, vector<TrieNodeInfo>& res)const
            {
                uint i = 0;
                while(i < segContext.size())
                {
                    const TrieNodeInfo* p = segContext[i].pInfo;
                    if(p)
                    {
                        res.push_back(*p);
                        i += p->word.size();
                    }
                    else//single chinese word
                    {
                        TrieNodeInfo nodeInfo;
                        nodeInfo.word.push_back(segContext[i].uniCh);
                        nodeInfo.freq = 0;
                        nodeInfo.logFreq = _trie.getMinLogFreq();
                        res.push_back(nodeInfo);
                        i++;
                    }
                }
                return true;
            }